

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface6.c
# Opt level: O3

void sv_send_cb(uv_udp_send_t *req,int status)

{
  int iVar1;
  bool bVar2;
  undefined8 *extraout_RDX;
  void **ppvVar4;
  uv_udp_t *puVar5;
  int in_R8D;
  int64_t eval_b;
  int64_t eval_a;
  void *pvStack_28;
  undefined1 auStack_20 [16];
  void *local_10;
  long lVar3;
  
  if (req == (uv_udp_send_t *)0x0) {
    auStack_20._0_8_ = (void *)0x1e1196;
    sv_send_cb_cold_3();
LAB_001e1196:
    auStack_20._0_8_ = (void *)0x1e11a3;
    sv_send_cb_cold_1();
  }
  else {
    local_10 = (void *)(long)status;
    auStack_20._8_8_ = (uv_loop_t *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001e1196;
    puVar5 = req->handle;
    local_10 = (void *)(ulong)(puVar5 == &client || puVar5 == &server);
    auStack_20._8_8_ = (uv_loop_t *)0x0;
    if (local_10 != (void *)0x0) {
      auStack_20._0_8_ = (void *)0x1e117d;
      uv_close(puVar5,close_cb);
      auStack_20._0_8_ = (void *)0x1e1185;
      free(req);
      sv_send_cb_called = sv_send_cb_called + 1;
      return;
    }
  }
  puVar5 = (uv_udp_t *)&stack0xfffffffffffffff0;
  auStack_20._0_8_ = close_cb;
  sv_send_cb_cold_2();
  bVar2 = puVar5 == &client || puVar5 == &server;
  lVar3 = CONCAT71(0xffda,bVar2);
  auStack_20._0_8_ = ZEXT18(bVar2);
  pvStack_28 = (void *)0x0;
  if ((void *)auStack_20._0_8_ == (void *)0x0) {
    close_cb_cold_2();
  }
  else {
    auStack_20._0_8_ = (void *)0x1;
    iVar1 = uv_is_closing();
    pvStack_28 = (void *)(long)iVar1;
    if ((void *)auStack_20._0_8_ == pvStack_28) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  puVar5 = (uv_udp_t *)auStack_20;
  ppvVar4 = &pvStack_28;
  close_cb_cold_1();
  if (puVar5 == &client || puVar5 == &server) {
    if (in_R8D != 0) goto LAB_001e1304;
    if ((long)ppvVar4 < 0) goto LAB_001e1311;
    if (ppvVar4 == (void **)0x0) {
      if (lVar3 == 0) {
        return;
      }
      goto LAB_001e132d;
    }
    if (lVar3 == 0) goto LAB_001e1316;
    lVar3 = 4;
    if (ppvVar4 != (void **)0x4) goto LAB_001e131b;
    iVar1 = bcmp("PONG",(void *)*extraout_RDX,4);
    if (iVar1 == 0) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      uv_close(puVar5,close_cb);
      return;
    }
  }
  else {
    cl_recv_cb_cold_7();
LAB_001e1304:
    cl_recv_cb_cold_1();
LAB_001e1311:
    cl_recv_cb_cold_6();
LAB_001e1316:
    cl_recv_cb_cold_4();
LAB_001e131b:
    cl_recv_cb_cold_2();
  }
  cl_recv_cb_cold_3();
LAB_001e132d:
  cl_recv_cb_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(lVar3,0);
  return;
}

Assistant:

static void sv_send_cb(uv_udp_send_t* req, int status) {
  ASSERT_NOT_NULL(req);
  ASSERT_OK(status);
  CHECK_HANDLE(req->handle);

  sv_send_cb_called++;

  uv_close((uv_handle_t*) req->handle, close_cb);
}